

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O3

void __thiscall
NodeParser::parseDemand
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  int *piVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  _List_node_base *p_Var6;
  InputError *pIVar7;
  undefined1 auStack_60 [8];
  Demand d;
  
  if (0x20 < (ulong)((long)(tokens->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokens->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    iVar5 = (*(node->super_Element)._vptr_Element[2])(node);
    if (iVar5 == 0) {
      Demand::Demand((Demand *)auStack_60);
      pbVar2 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar5 = (int)((ulong)((long)(tokens->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5);
      if (1 < iVar5) {
        bVar4 = Utilities::parseNumber<double>(pbVar2 + 1,(double *)auStack_60);
        if (!bVar4) {
          pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
          d.timePattern = (Pattern *)&stack0xffffffffffffffc8;
          pcVar3 = pbVar2[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&d.timePattern,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
          InputError::InputError(pIVar7,6,(string *)&d.timePattern);
          __cxa_throw(pIVar7,&InputError::typeinfo,ENerror::~ENerror);
        }
        if (iVar5 != 2) {
          iVar5 = std::__cxx11::string::compare((char *)(pbVar2 + 2));
          if (iVar5 != 0) {
            d.fullDemand = (double)Network::pattern(nw,pbVar2 + 2);
            if ((Pattern *)d.fullDemand == (Pattern *)0x0) {
              pIVar7 = (InputError *)__cxa_allocate_exception(0x30);
              d.timePattern = (Pattern *)&stack0xffffffffffffffc8;
              pcVar3 = pbVar2[2]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&d.timePattern,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
              InputError::InputError(pIVar7,5,(string *)&d.timePattern);
              __cxa_throw(pIVar7,&InputError::typeinfo,ENerror::~ENerror);
            }
          }
        }
      }
      p_Var6 = (_List_node_base *)operator_new(0x28);
      p_Var6[2]._M_next = (_List_node_base *)d.fullDemand;
      p_Var6[1]._M_next = (_List_node_base *)auStack_60;
      p_Var6[1]._M_prev = (_List_node_base *)d.baseDemand;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      piVar1 = &node[1].super_Element.index;
      *(long *)piVar1 = *(long *)piVar1 + 1;
      Demand::~Demand((Demand *)auStack_60);
    }
  }
  return;
}

Assistant:

void NodeParser::parseDemand(Node* node, Network* nw, vector<string>& tokens)
{
    // ... cast Node to Junction
    if ( tokens.size() < 2 ) return;
    if ( node->type() != Node::JUNCTION ) return;
    Junction* junc = static_cast<Junction*>(node);

    // ... declare a demand object and read its parameters
    Demand d;
    parseDemandData(d, nw, tokens);

    // ... add demand to junction
    //     (demand d passed by value so a copy is being added to demands list)
    junc->demands.push_back(d);
}